

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_parser.hpp
# Opt level: O1

void __thiscall
jsoncons::csv::basic_csv_parser<char,_std::allocator<char>_>::end_value_with_numeric_check
          (basic_csv_parser<char,_std::allocator<char>_> *this,basic_json_visitor<char> *visitor,
          error_code *ec)

{
  byte bVar1;
  char cVar2;
  pointer pcVar3;
  size_type sVar4;
  int iVar5;
  char cVar6;
  long lVar7;
  bool bVar8;
  int64_t val;
  string buffer;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  long local_58;
  basic_json_visitor<char> *local_50;
  error_code *local_48;
  size_type local_40;
  pointer local_38;
  
  pcVar3 = (this->buffer_)._M_dataplus._M_p;
  sVar4 = (this->buffer_)._M_string_length;
  local_78 = &local_68;
  local_70 = 0;
  local_68 = 0;
  if (sVar4 == 0) {
    iVar5 = 0;
  }
  else {
    local_58 = sVar4 - 5;
    iVar5 = 0;
    lVar7 = 0;
    local_50 = visitor;
    local_48 = ec;
    do {
      cVar6 = (char)&local_78;
      switch(iVar5) {
      case 0:
        bVar1 = pcVar3[lVar7];
        iVar5 = 0xb;
        if (bVar1 < 0x4e) {
          switch(bVar1) {
          case 0x2d:
            std::__cxx11::string::push_back(cVar6);
            iVar5 = 4;
            break;
          case 0x30:
switchD_002fe546_caseD_30:
            iVar5 = 5;
            std::__cxx11::string::push_back(cVar6);
            break;
          case 0x31:
          case 0x32:
          case 0x33:
          case 0x34:
          case 0x35:
          case 0x36:
          case 0x37:
          case 0x38:
          case 0x39:
            goto switchD_002fe546_caseD_31;
          case 0x46:
switchD_002fe546_caseD_46:
            if ((((local_58 == lVar7) && ((byte)(pcVar3[lVar7 + 1] | 0x20U) == 0x61)) &&
                ((byte)(pcVar3[lVar7 + 2] | 0x20U) == 0x6c)) &&
               (((byte)(pcVar3[lVar7 + 3] | 0x20U) == 0x73 &&
                ((byte)(pcVar3[lVar7 + 4] | 0x20U) == 0x65)))) {
              iVar5 = 3;
            }
          }
        }
        else if (bVar1 < 0x66) {
          if (bVar1 == 0x4e) {
LAB_002fe7c9:
            if ((((sVar4 - 4 == lVar7) && ((byte)(pcVar3[lVar7 + 1] | 0x20U) == 0x75)) &&
                ((byte)(pcVar3[lVar7 + 2] | 0x20U) == 0x6c)) &&
               ((byte)(pcVar3[lVar7 + 3] | 0x20U) == 0x6c)) {
              iVar5 = 1;
            }
          }
          else if (bVar1 == 0x54) goto LAB_002fe72b;
        }
        else {
          if (bVar1 == 0x66) goto switchD_002fe546_caseD_46;
          if (bVar1 != 0x74) {
            if (bVar1 != 0x6e) break;
            goto LAB_002fe7c9;
          }
LAB_002fe72b:
          if (((sVar4 - 4 == lVar7) && ((byte)(pcVar3[lVar7 + 1] | 0x20U) == 0x72)) &&
             (((byte)(pcVar3[lVar7 + 2] | 0x20U) == 0x75 &&
              ((pcVar3[lVar7 + 3] == 'U' || (pcVar3[lVar7 + 3] == 'e')))))) {
            iVar5 = 2;
          }
        }
        break;
      case 4:
        if ((byte)pcVar3[lVar7] - 0x31 < 9) {
switchD_002fe546_caseD_31:
          iVar5 = 6;
          std::__cxx11::string::push_back(cVar6);
        }
        else {
          iVar5 = 0xb;
          if (pcVar3[lVar7] == 0x30) goto switchD_002fe546_caseD_30;
        }
        break;
      case 5:
        cVar2 = pcVar3[lVar7];
        if (cVar2 == '.') {
LAB_002fe6a5:
          iVar5 = 7;
          std::__cxx11::string::push_back(cVar6);
        }
        else if ((cVar2 == 'E') || (iVar5 = 0xb, cVar2 == 'e')) {
LAB_002fe6c0:
          iVar5 = 9;
          std::__cxx11::string::push_back(cVar6);
        }
        break;
      case 6:
        bVar1 = pcVar3[lVar7];
        if (bVar1 - 0x30 < 10) {
LAB_002fe637:
          std::__cxx11::string::push_back(cVar6);
        }
        else {
          if ((bVar1 == 0x65) || (bVar1 == 0x45)) goto LAB_002fe6c0;
          iVar5 = 0xb;
          if (bVar1 == 0x2e) goto LAB_002fe6a5;
        }
        break;
      case 7:
        iVar5 = 0xb;
        if ((byte)(pcVar3[lVar7] - 0x30U) < 10) {
          iVar5 = 8;
          std::__cxx11::string::push_back(cVar6);
        }
        break;
      case 8:
        bVar1 = pcVar3[lVar7];
        if (bVar1 - 0x30 < 10) goto LAB_002fe637;
        if ((bVar1 == 0x65) || (iVar5 = 0xb, bVar1 == 0x45)) goto LAB_002fe6c0;
        break;
      case 9:
        bVar1 = pcVar3[lVar7];
        if (bVar1 - 0x30 < 10) {
          iVar5 = 10;
          std::__cxx11::string::push_back(cVar6);
        }
        else if (bVar1 != 0x2b) {
          if (bVar1 != 0x2d) goto LAB_002fe5f2;
          goto LAB_002fe637;
        }
        break;
      case 10:
        if ((byte)(pcVar3[lVar7] - 0x30U) < 10) goto LAB_002fe637;
LAB_002fe5f2:
        iVar5 = 0xb;
      }
      visitor = local_50;
      ec = local_48;
    } while ((iVar5 != 0xb) && (bVar8 = sVar4 - 1 != lVar7, lVar7 = lVar7 + 1, bVar8));
  }
  if (iVar5 - 1U < 10) {
    (*(code *)(&DAT_00840738 + *(int *)(&DAT_00840738 + (ulong)(iVar5 - 1U) * 4)))();
    return;
  }
  local_38 = (this->buffer_)._M_dataplus._M_p;
  local_40 = (this->buffer_)._M_string_length;
  (*visitor->_vptr_basic_json_visitor[0xc])(visitor,&local_40,0,this,ec);
  this->more_ = (bool)(this->cursor_mode_ ^ 1);
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  return;
}

Assistant:

void end_value_with_numeric_check(basic_json_visitor<CharT>& visitor, 
        std::error_code& ec)
    {
        numeric_check_state state = numeric_check_state::initial;
        bool is_negative = false;
        //int precision = 0;
        //uint8_t decimal_places = 0;

        auto last = buffer_.end();

        std::string buffer;
        for (auto p = buffer_.begin(); state != numeric_check_state::not_a_number && p != last; ++p)
        {
            switch (state)
            {
                case numeric_check_state::initial:
                {
                    switch (*p)
                    {
                    case 'n':case 'N':
                        if ((last-p) == 4 && (p[1] == 'u' || p[1] == 'U') && (p[2] == 'l' || p[2] == 'L') && (p[3] == 'l' || p[3] == 'L'))
                        {
                            state = numeric_check_state::null;
                        }
                        else
                        {
                            state = numeric_check_state::not_a_number;
                        }
                        break;
                    case 't':case 'T':
                        if ((last-p) == 4 && (p[1] == 'r' || p[1] == 'R') && (p[2] == 'u' || p[2] == 'U') && (p[3] == 'e' || p[3] == 'U'))
                        {
                            state = numeric_check_state::boolean_true;
                        }
                        else
                        {
                            state = numeric_check_state::not_a_number;
                        }
                        break;
                    case 'f':case 'F':
                        if ((last-p) == 5 && (p[1] == 'a' || p[1] == 'A') && (p[2] == 'l' || p[2] == 'L') && (p[3] == 's' || p[3] == 'S') && (p[4] == 'e' || p[4] == 'E'))
                        {
                            state = numeric_check_state::boolean_false;
                        }
                        else
                        {
                            state = numeric_check_state::not_a_number;
                        }
                        break;
                    case '-':
                        is_negative = true;
                        buffer.push_back(*p);
                        state = numeric_check_state::minus;
                        break;
                    case '0':
                        //++precision;
                        buffer.push_back(*p);
                        state = numeric_check_state::zero;
                        break;
                    case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8':case '9':
                        //++precision;
                        buffer.push_back(*p);
                        state = numeric_check_state::integer;
                        break;
                    default:
                        state = numeric_check_state::not_a_number;
                        break;
                    }
                    break;
                }
                case numeric_check_state::zero:
                {
                    switch (*p)
                    {
                    case '.':
                        buffer.push_back(to_double_.get_decimal_point());
                        state = numeric_check_state::fraction1;
                        break;
                    case 'e':case 'E':
                        buffer.push_back(*p);
                        state = numeric_check_state::exp1;
                        break;
                    default:
                        state = numeric_check_state::not_a_number;
                        break;
                    }
                    break;
                }
                case numeric_check_state::integer:
                {
                    switch (*p)
                    {
                    case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8':case '9':
                        //++precision;
                        buffer.push_back(*p);
                        break;
                    case '.':
                        buffer.push_back(to_double_.get_decimal_point());
                        state = numeric_check_state::fraction1;
                        break;
                    case 'e':case 'E':
                        buffer.push_back(*p);
                        state = numeric_check_state::exp1;
                        break;
                    default:
                        state = numeric_check_state::not_a_number;
                        break;
                    }
                    break;
                }
                case numeric_check_state::minus:
                {
                    switch (*p)
                    {
                    case '0':
                        //++precision;
                        buffer.push_back(*p);
                        state = numeric_check_state::zero;
                        break;
                    case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8':case '9':
                        //++precision;
                        buffer.push_back(*p);
                        state = numeric_check_state::integer;
                        break;
                    default:
                        state = numeric_check_state::not_a_number;
                        break;
                    }
                    break;
                }
                case numeric_check_state::fraction1:
                {
                    switch (*p)
                    {
                    case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8':case '9':
                        //++precision;
                        //++decimal_places;
                        buffer.push_back(*p);
                        state = numeric_check_state::fraction;
                        break;
                    default:
                        state = numeric_check_state::not_a_number;
                        break;
                    }
                    break;
                }
                case numeric_check_state::fraction:
                {
                    switch (*p)
                    {
                    case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8':case '9':
                        //++precision;
                        //++decimal_places;
                        buffer.push_back(*p);
                        break;
                    case 'e':case 'E':
                        buffer.push_back(*p);
                        state = numeric_check_state::exp1;
                        break;
                    default:
                        state = numeric_check_state::not_a_number;
                        break;
                    }
                    break;
                }
                case numeric_check_state::exp1:
                {
                    switch (*p)
                    {
                    case '-':
                        buffer.push_back(*p);
                        break;
                    case '+':
                        break;
                    case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8':case '9':
                        state = numeric_check_state::exp;
                        buffer.push_back(*p);
                        break;
                    default:
                        state = numeric_check_state::not_a_number;
                        break;
                    }
                    break;
                }
                case numeric_check_state::exp:
                {
                    switch (*p)
                    {
                    case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8':case '9':
                        buffer.push_back(*p);
                        break;
                    default:
                        state = numeric_check_state::not_a_number;
                        break;
                    }
                    break;
                }
                default:
                    break;
            }
        }

        switch (state)
        {
            case numeric_check_state::null:
                visitor.null_value(semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            case numeric_check_state::boolean_true:
                visitor.bool_value(true, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            case numeric_check_state::boolean_false:
                visitor.bool_value(false, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            case numeric_check_state::zero:
            case numeric_check_state::integer:
            {
                if (is_negative)
                {
                    int64_t val{ 0 };
                    auto result = jsoncons::detail::dec_to_integer(buffer_.data(), buffer_.length(), val);
                    if (result)
                    {
                        visitor.int64_value(val, semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                    }
                    else // Must be overflow
                    {
                        visitor.string_value(buffer_, semantic_tag::bigint, *this, ec);
                        more_ = !cursor_mode_;
                    }
                }
                else
                {
                    uint64_t val{ 0 };
                    auto result = jsoncons::detail::dec_to_integer(buffer_.data(), buffer_.length(), val);
                    if (result)
                    {
                        visitor.uint64_value(val, semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                    }
                    else if (result.ec == jsoncons::detail::to_integer_errc::overflow)
                    {
                        visitor.string_value(buffer_, semantic_tag::bigint, *this, ec);
                        more_ = !cursor_mode_;
                    }
                    else
                    {
                        ec = result.ec;
                        more_ = false;
                        return;
                    }
                }
                break;
            }
            case numeric_check_state::fraction:
            case numeric_check_state::exp:
            {
                if (lossless_number_)
                {
                    visitor.string_value(buffer_,semantic_tag::bigdec, *this, ec);
                    more_ = !cursor_mode_;
                }
                else
                {
                    double d = to_double_(buffer.c_str(), buffer.length());
                    visitor.double_value(d, semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                }
                break;
            }
            default:
            {
                visitor.string_value(buffer_, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
        }
    }